

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall capnp::SchemaLoader::Impl::getUnbound(Impl *this,RawSchema *schema)

{
  RawSchema *schema_00;
  bool bVar1;
  Dependency *pDVar2;
  size_t sVar3;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar4;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_90;
  undefined1 local_78 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  RawBrandedSchema *slot;
  RawBrandedSchema **local_58;
  RawBrandedSchema **existing;
  RawSchema *local_20;
  RawSchema *schema_local;
  Impl *this_local;
  
  local_20 = schema;
  schema_local = (RawSchema *)this;
  readMessageUnchecked<capnp::schema::Node>((Reader *)&existing,schema->encodedNode);
  bVar1 = capnp::schema::Node::Reader::getIsGeneric((Reader *)&existing);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    slot = (RawBrandedSchema *)
           kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
           find<capnp::_::RawSchema_const*&>
                     ((HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *)
                      &this->unboundBrands,&local_20);
    local_58 = kj::_::readMaybe<capnp::_::RawBrandedSchema*>
                         ((Maybe<capnp::_::RawBrandedSchema_*&> *)&slot);
    if (local_58 == (RawBrandedSchema **)0x0) {
      deps.size_ = (size_t)kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      schema_00 = local_20;
      ((RawBrandedSchema *)deps.size_)->dependencies = (Dependency *)0x0;
      ((RawBrandedSchema *)deps.size_)->scopeCount = 0;
      ((RawBrandedSchema *)deps.size_)->dependencyCount = 0;
      ((RawBrandedSchema *)deps.size_)->generic = (RawSchema *)0x0;
      ((RawBrandedSchema *)deps.size_)->scopes = (Scope *)0x0;
      ((RawBrandedSchema *)deps.size_)->lazyInitializer = (Initializer *)0x0;
      ((RawBrandedSchema *)deps.size_)->generic = local_20;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                (&local_90,(void *)0x0);
      AVar4 = makeBrandedDependencies(this,schema_00,&local_90);
      deps.ptr = (Dependency *)AVar4.size_;
      local_78 = (undefined1  [8])AVar4.ptr;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_90);
      pDVar2 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                         ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_78);
      *(Dependency **)(deps.size_ + 0x10) = pDVar2;
      sVar3 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_78);
      *(int *)(deps.size_ + 0x1c) = (int)sVar3;
      kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::insert
                (&this->unboundBrands,local_20,(RawBrandedSchema *)deps.size_);
      this_local = (Impl *)deps.size_;
    }
    else {
      this_local = (Impl *)*local_58;
    }
  }
  else {
    this_local = (Impl *)&local_20->defaultBrand;
  }
  return (RawBrandedSchema *)this_local;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::getUnbound(const _::RawSchema* schema) {
  if (!readMessageUnchecked<schema::Node>(schema->encodedNode).getIsGeneric()) {
    // Not a generic type, so just return the default brand.
    return &schema->defaultBrand;
  }

  KJ_IF_MAYBE(existing, unboundBrands.find(schema)) {
    return *existing;
  } else {
    auto slot = &arena.allocate<_::RawBrandedSchema>();
    memset(slot, 0, sizeof(*slot));
    slot->generic = schema;
    auto deps = makeBrandedDependencies(schema, nullptr);
    slot->dependencies = deps.begin();
    slot->dependencyCount = deps.size();
    unboundBrands.insert(schema, slot);
    return slot;
  }